

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::directiveList(GrpParser *this)

{
  ASTFactory *this_00;
  RefAST RVar1;
  int iVar2;
  NoViableAltException *pNVar3;
  RefAST tmp24_AST;
  ASTFactory local_a0;
  RefAST *local_90;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefAST tmp21_AST;
  ASTPair currentAST;
  RefToken local_58;
  RefToken local_50;
  RefCount<AST> local_48;
  RefAST local_40;
  RefCount<Token> local_38;
  
  local_90 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(local_90,&nullAST);
  local_a0.nodeFactory = (factory_type)nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 2;
  }
  tmp21_AST = (RefAST)local_a0.nodeFactory;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  this_00 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp24_AST,(RefToken *)this_00);
  RefCount<AST>::operator=(&tmp21_AST,&tmp24_AST);
  RefCount<AST>::~RefCount(&tmp24_AST);
  RefCount<Token>::~RefCount(&local_78);
  Parser::match((Parser *)this,0xb);
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar2 != 0xc) {
    if (iVar2 != 0xd) {
      pNVar3 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
      NoViableAltException::NoViableAltException(pNVar3,&local_58);
      __cxa_throw(pNVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    directive(this);
    local_40.ref = local_90->ref;
    if (local_40.ref != (Ref *)0x0) {
      (local_40.ref)->count = (local_40.ref)->count + 1;
    }
    ASTFactory::addASTChild(this_00,&currentAST,&local_40);
    RefCount<AST>::~RefCount(&local_40);
    while( true ) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar2 != 8) break;
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar2 != 0xd) break;
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      RVar1 = nullAST;
      if (iVar2 != 4) break;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      tmp24_AST = RVar1;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_38,this,1);
      ASTFactory::create(&local_a0,(RefToken *)this_00);
      RefCount<AST>::operator=(&tmp24_AST,(RefCount<AST> *)&local_a0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_a0);
      RefCount<Token>::~RefCount(&local_38);
      Parser::match((Parser *)this,8);
      directive(this);
      local_48.ref = local_90->ref;
      if (local_48.ref != (Ref *)0x0) {
        (local_48.ref)->count = (local_48.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_00,&currentAST,&local_48);
      RefCount<AST>::~RefCount(&local_48);
      RefCount<AST>::~RefCount(&tmp24_AST);
    }
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar1 = nullAST;
    if (iVar2 != 0xc) {
      if (iVar2 != 8) {
        pNVar3 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
        NoViableAltException::NoViableAltException(pNVar3,&local_50);
        __cxa_throw(pNVar3,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      tmp24_AST = RVar1;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
      ASTFactory::create(&local_a0,(RefToken *)this_00);
      RefCount<AST>::operator=(&tmp24_AST,(RefCount<AST> *)&local_a0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_a0);
      RefCount<Token>::~RefCount(&local_80);
      Parser::match((Parser *)this,8);
      RefCount<AST>::~RefCount(&tmp24_AST);
    }
  }
  tmp24_AST.ref = nullAST.ref;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
  ASTFactory::create(&local_a0,(RefToken *)this_00);
  RefCount<AST>::operator=(&tmp24_AST,(RefCount<AST> *)&local_a0);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_a0);
  RefCount<Token>::~RefCount(&local_88);
  Parser::match((Parser *)this,0xc);
  RefCount<AST>::operator=((RefCount<AST> *)&local_a0.nodeFactory,&currentAST.root);
  RefCount<AST>::~RefCount(&tmp24_AST);
  RefCount<AST>::~RefCount(&tmp21_AST);
  RefCount<AST>::operator=(local_90,(RefCount<AST> *)&local_a0.nodeFactory);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_a0.nodeFactory);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::directiveList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST directiveList_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp21_AST = nullAST;
		tmp21_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		{
			directive();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((LA(1)==OP_SEMI) && (LA(2)==IDENT) && (LA(3)==OP_EQ)) {
					RefAST tmp22_AST = nullAST;
					tmp22_AST = astFactory.create(LT(1));
					match(OP_SEMI);
					directive();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop20;
				}
				
			} while (true);
			_loop20:;
			}
			{
			switch ( LA(1)) {
			case OP_SEMI:
			{
				RefAST tmp23_AST = nullAST;
				tmp23_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				break;
			}
			case OP_RBRACE:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp24_AST = nullAST;
		tmp24_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		directiveList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_9);
	}
	returnAST = directiveList_AST;
}